

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

void __thiscall kj::UnixEventPort::ChildSet::checkExits(ChildSet *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  char *pcVar3;
  long *plVar4;
  __pid_t _Var5;
  int iVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  int status;
  Fault f;
  int local_44;
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  p_Var1 = &(this->waiters)._M_t._M_impl.super__Rb_tree_header;
LAB_0049934b:
  _Var5 = waitpid(-1,&local_44,1);
  if (_Var5 < 0) goto code_r0x00499363;
  if (_Var5 == 0) {
    return;
  }
  goto LAB_00499377;
code_r0x00499363:
  iVar6 = kj::_::Debug::getOsErrorNumber(false);
  if (iVar6 != -1) {
    if (iVar6 != 0) {
      if (iVar6 == 10) {
        return;
      }
      local_40.exception = (Exception *)0x0;
      local_38 = 0;
      uStack_30 = 0;
      kj::_::Debug::Fault::init
                (&local_40,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_40);
    }
LAB_00499377:
    p_Var8 = (this->waiters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &p_Var1->_M_header;
    if (p_Var8 != (_Base_ptr)0x0) {
      do {
        if (_Var5 <= (int)*(size_t *)(p_Var8 + 1)) {
          p_Var7 = p_Var8;
        }
        p_Var8 = (&p_Var8->_M_left)[(int)*(size_t *)(p_Var8 + 1) < _Var5];
      } while (p_Var8 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         ((int)((_Rb_tree_header *)p_Var7)->_M_node_count <= _Var5)) {
        lVar2 = *(long *)((long)p_Var7 + 0x28);
        pcVar3 = *(char **)(lVar2 + 0x10);
        if (*pcVar3 == '\x01') {
          *pcVar3 = '\0';
        }
        plVar4 = *(long **)(lVar2 + 0x18);
        local_38 = CONCAT44(local_38._4_4_,local_44);
        (**(code **)(*plVar4 + 0x10))(plVar4,&local_38);
      }
    }
  }
  goto LAB_0049934b;
}

Assistant:

void UnixEventPort::ChildSet::checkExits() {
  for (;;) {
    int status;
    pid_t pid;
    KJ_SYSCALL_HANDLE_ERRORS(pid = waitpid(-1, &status, WNOHANG)) {
      case ECHILD:
        return;
      default:
        KJ_FAIL_SYSCALL("waitpid()", error);
    }
    if (pid == 0) break;

    auto iter = waiters.find(pid);
    if (iter != waiters.end()) {
      iter->second->pidRef = kj::none;
      iter->second->fulfiller.fulfill(kj::cp(status));
    }
  }
}